

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_16777232,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar4;
  float fVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  Geometry *pGVar7;
  RTCIntersectArguments *pRVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ulong uVar13;
  AABBNodeMB4D *node1;
  ulong uVar14;
  long lVar15;
  ulong unaff_RBX;
  size_t mask;
  int iVar16;
  ulong uVar17;
  size_t sVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  byte bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  int local_149c;
  ulong local_1498;
  ulong local_1490;
  NodeRef *local_1488;
  ulong local_1480;
  ulong local_1478;
  ulong local_1470;
  ulong local_1468;
  ulong local_1460;
  Ray *local_1458;
  RayQueryContext *local_1450;
  ulong local_1448;
  Scene *local_1440;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  undefined1 local_12d8 [16];
  undefined1 local_12c8 [16];
  undefined1 local_12b8 [16];
  undefined1 local_12a8 [16];
  undefined1 local_1298 [16];
  undefined1 local_1288 [16];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  float fVar2;
  float fVar3;
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    if (0.0 <= ray->tfar) {
      local_1488 = stack + 1;
      aVar6 = (ray->dir).field_0;
      auVar45 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar23._8_4_ = 0x7fffffff;
      auVar23._0_8_ = 0x7fffffff7fffffff;
      auVar23._12_4_ = 0x7fffffff;
      auVar23 = vandps_avx512vl((undefined1  [16])aVar6,auVar23);
      auVar24._8_4_ = 0x219392ef;
      auVar24._0_8_ = 0x219392ef219392ef;
      auVar24._12_4_ = 0x219392ef;
      uVar19 = vcmpps_avx512vl(auVar23,auVar24,1);
      auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar62 = ZEXT1664(auVar23);
      auVar23 = vdivps_avx512vl(auVar23,(undefined1  [16])aVar6);
      auVar24 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar21 = (bool)((byte)uVar19 & 1);
      auVar31._0_4_ = (uint)bVar21 * auVar24._0_4_ | (uint)!bVar21 * auVar23._0_4_;
      bVar21 = (bool)((byte)(uVar19 >> 1) & 1);
      auVar31._4_4_ = (uint)bVar21 * auVar24._4_4_ | (uint)!bVar21 * auVar23._4_4_;
      bVar21 = (bool)((byte)(uVar19 >> 2) & 1);
      auVar31._8_4_ = (uint)bVar21 * auVar24._8_4_ | (uint)!bVar21 * auVar23._8_4_;
      bVar21 = (bool)((byte)(uVar19 >> 3) & 1);
      auVar31._12_4_ = (uint)bVar21 * auVar24._12_4_ | (uint)!bVar21 * auVar23._12_4_;
      auVar25._8_4_ = 0x3f7ffffa;
      auVar25._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar25._12_4_ = 0x3f7ffffa;
      auVar25 = vmulps_avx512vl(auVar31,auVar25);
      auVar26._8_4_ = 0x3f800003;
      auVar26._0_8_ = 0x3f8000033f800003;
      auVar26._12_4_ = 0x3f800003;
      auVar26 = vmulps_avx512vl(auVar31,auVar26);
      auVar46 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[0]));
      auVar63 = ZEXT3264(auVar46);
      auVar46 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar64 = ZEXT3264(auVar46);
      auVar46 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
      auVar65 = ZEXT3264(auVar46);
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar46 = vbroadcastss_avx512vl(auVar25);
      auVar66 = ZEXT3264(auVar46);
      auVar23 = vmovshdup_avx(auVar25);
      auVar46 = vbroadcastsd_avx512vl(auVar23);
      auVar67 = ZEXT3264(auVar46);
      auVar24 = vshufpd_avx(auVar25,auVar25,1);
      auVar49._8_4_ = 2;
      auVar49._0_8_ = 0x200000002;
      auVar49._12_4_ = 2;
      auVar49._16_4_ = 2;
      auVar49._20_4_ = 2;
      auVar49._24_4_ = 2;
      auVar49._28_4_ = 2;
      auVar46 = vpermps_avx512vl(auVar49,ZEXT1632(auVar25));
      auVar47 = vbroadcastss_avx512vl(auVar26);
      auVar48._8_4_ = 1;
      auVar48._0_8_ = 0x100000001;
      auVar48._12_4_ = 1;
      auVar48._16_4_ = 1;
      auVar48._20_4_ = 1;
      auVar48._24_4_ = 1;
      auVar48._28_4_ = 1;
      auVar48 = vpermps_avx512vl(auVar48,ZEXT1632(auVar26));
      auVar49 = vpermps_avx512vl(auVar49,ZEXT1632(auVar26));
      local_1490 = (ulong)(auVar25._0_4_ < 0.0) << 5;
      local_1498 = (ulong)(auVar23._0_4_ < 0.0) << 5 | 0x40;
      local_1478 = (ulong)(auVar24._0_4_ < 0.0) << 5 | 0x80;
      local_1480 = local_1490 ^ 0x20;
      uVar19 = local_1498 ^ 0x20;
      uVar20 = local_1478 ^ 0x20;
      auVar50 = vbroadcastss_avx512vl(auVar45);
      auVar51 = vbroadcastss_avx512vl(ZEXT416((uint)ray->tfar));
      local_1470 = uVar20;
      local_1468 = uVar19;
      do {
        if (local_1488 == stack) {
          return;
        }
        sVar18 = local_1488[-1].ptr;
        local_1488 = local_1488 + -1;
        do {
          if ((sVar18 & 8) == 0) {
            uVar14 = sVar18 & 0xfffffffffffffff0;
            uVar4 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
            auVar56._4_4_ = uVar4;
            auVar56._0_4_ = uVar4;
            auVar56._8_4_ = uVar4;
            auVar56._12_4_ = uVar4;
            auVar56._16_4_ = uVar4;
            auVar56._20_4_ = uVar4;
            auVar56._24_4_ = uVar4;
            auVar56._28_4_ = uVar4;
            auVar45 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar14 + 0x100 + local_1490),auVar56,
                                      *(undefined1 (*) [32])(uVar14 + 0x40 + local_1490));
            auVar52 = vsubps_avx512vl(ZEXT1632(auVar45),auVar63._0_32_);
            auVar52 = vmulps_avx512vl(auVar66._0_32_,auVar52);
            auVar53 = vmaxps_avx512vl(auVar50,auVar52);
            auVar45 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar14 + 0x100 + local_1498),auVar56,
                                      *(undefined1 (*) [32])(uVar14 + 0x40 + local_1498));
            auVar52 = vsubps_avx512vl(ZEXT1632(auVar45),auVar64._0_32_);
            auVar52 = vmulps_avx512vl(auVar67._0_32_,auVar52);
            auVar45 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar14 + 0x100 + local_1478),auVar56,
                                      *(undefined1 (*) [32])(uVar14 + 0x40 + local_1478));
            auVar54 = vsubps_avx512vl(ZEXT1632(auVar45),auVar65._0_32_);
            auVar54 = vmulps_avx512vl(auVar46,auVar54);
            auVar52 = vmaxps_avx(auVar52,auVar54);
            auVar52 = vmaxps_avx(auVar53,auVar52);
            auVar45 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar14 + 0x100 + local_1480),auVar56,
                                      *(undefined1 (*) [32])(uVar14 + 0x40 + local_1480));
            auVar53 = vsubps_avx512vl(ZEXT1632(auVar45),auVar63._0_32_);
            auVar53 = vmulps_avx512vl(auVar47,auVar53);
            auVar54 = vminps_avx512vl(auVar51,auVar53);
            auVar45 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar14 + 0x100 + uVar19),auVar56,
                                      *(undefined1 (*) [32])(uVar14 + 0x40 + uVar19));
            auVar53 = vsubps_avx512vl(ZEXT1632(auVar45),auVar64._0_32_);
            auVar53 = vmulps_avx512vl(auVar48,auVar53);
            auVar45 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar14 + 0x100 + uVar20),auVar56,
                                      *(undefined1 (*) [32])(uVar14 + 0x40 + uVar20));
            auVar55 = vsubps_avx512vl(ZEXT1632(auVar45),auVar65._0_32_);
            auVar55 = vmulps_avx512vl(auVar49,auVar55);
            auVar53 = vminps_avx(auVar53,auVar55);
            auVar53 = vminps_avx(auVar54,auVar53);
            if (((uint)sVar18 & 7) == 6) {
              uVar12 = vcmpps_avx512vl(auVar52,auVar53,2);
              uVar10 = vcmpps_avx512vl(auVar56,*(undefined1 (*) [32])(uVar14 + 0x1c0),0xd);
              uVar11 = vcmpps_avx512vl(auVar56,*(undefined1 (*) [32])(uVar14 + 0x1e0),1);
              bVar22 = (byte)uVar12 & (byte)uVar10 & (byte)uVar11;
            }
            else {
              uVar12 = vcmpps_avx512vl(auVar52,auVar53,2);
              bVar22 = (byte)uVar12;
            }
            unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),(uint)bVar22);
          }
          if ((sVar18 & 8) == 0) {
            if (unaff_RBX == 0) {
              iVar16 = 4;
            }
            else {
              uVar17 = sVar18 & 0xfffffffffffffff0;
              lVar15 = 0;
              for (uVar14 = unaff_RBX; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000)
              {
                lVar15 = lVar15 + 1;
              }
              iVar16 = 0;
              for (uVar14 = unaff_RBX - 1 & unaff_RBX; sVar18 = *(size_t *)(uVar17 + lVar15 * 8),
                  uVar14 != 0; uVar14 = uVar14 - 1 & uVar14) {
                local_1488->ptr = sVar18;
                local_1488 = local_1488 + 1;
                lVar15 = 0;
                for (uVar13 = uVar14; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000)
                {
                  lVar15 = lVar15 + 1;
                }
              }
            }
          }
          else {
            iVar16 = 6;
          }
        } while (iVar16 == 0);
        if (iVar16 == 6) {
          iVar16 = 0;
          local_1448 = (ulong)((uint)sVar18 & 0xf) - 8;
          bVar21 = local_1448 != 0;
          if (bVar21) {
            uVar17 = sVar18 & 0xfffffffffffffff0;
            uVar14 = 0;
            do {
              lVar15 = uVar14 * 0x140;
              uVar4 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
              auVar27._4_4_ = uVar4;
              auVar27._0_4_ = uVar4;
              auVar27._8_4_ = uVar4;
              auVar27._12_4_ = uVar4;
              auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0x90 + lVar15),auVar27,
                                        *(undefined1 (*) [16])(uVar17 + lVar15));
              auVar23 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0xa0 + lVar15),auVar27,
                                        *(undefined1 (*) [16])(uVar17 + 0x10 + lVar15));
              auVar24 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0xb0 + lVar15),auVar27,
                                        *(undefined1 (*) [16])(uVar17 + 0x20 + lVar15));
              auVar25 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0xc0 + lVar15),auVar27,
                                        *(undefined1 (*) [16])(uVar17 + 0x30 + lVar15));
              auVar26 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0xd0 + lVar15),auVar27,
                                        *(undefined1 (*) [16])(uVar17 + 0x40 + lVar15));
              auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0xe0 + lVar15),auVar27,
                                        *(undefined1 (*) [16])(uVar17 + 0x50 + lVar15));
              auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0xf0 + lVar15),auVar27,
                                        *(undefined1 (*) [16])(uVar17 + 0x60 + lVar15));
              auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0x100 + lVar15),auVar27,
                                        *(undefined1 (*) [16])(uVar17 + 0x70 + lVar15));
              auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar17 + 0x110 + lVar15),auVar27,
                                        *(undefined1 (*) [16])(uVar17 + 0x80 + lVar15));
              uVar4 = *(undefined4 *)&(ray->org).field_0;
              auVar35._4_4_ = uVar4;
              auVar35._0_4_ = uVar4;
              auVar35._8_4_ = uVar4;
              auVar35._12_4_ = uVar4;
              auVar27 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
              auVar28 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
              uVar4 = *(undefined4 *)&(ray->dir).field_0;
              auVar57._4_4_ = uVar4;
              auVar57._0_4_ = uVar4;
              auVar57._8_4_ = uVar4;
              auVar57._12_4_ = uVar4;
              uVar4 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
              auVar58._4_4_ = uVar4;
              auVar58._0_4_ = uVar4;
              auVar58._8_4_ = uVar4;
              auVar58._12_4_ = uVar4;
              fVar5 = (ray->dir).field_0.m128[2];
              auVar60._4_4_ = fVar5;
              auVar60._0_4_ = fVar5;
              auVar60._8_4_ = fVar5;
              auVar60._12_4_ = fVar5;
              auVar45 = vsubps_avx(auVar45,auVar35);
              auVar29 = vsubps_avx512vl(auVar23,auVar27);
              auVar30 = vsubps_avx512vl(auVar24,auVar28);
              auVar25 = vsubps_avx512vl(auVar25,auVar35);
              auVar26 = vsubps_avx512vl(auVar26,auVar27);
              auVar31 = vsubps_avx512vl(auVar31,auVar28);
              auVar32 = vsubps_avx512vl(auVar32,auVar35);
              auVar33 = vsubps_avx512vl(auVar33,auVar27);
              auVar34 = vsubps_avx512vl(auVar34,auVar28);
              auVar27 = vsubps_avx512vl(auVar32,auVar45);
              auVar23 = vsubps_avx(auVar33,auVar29);
              auVar28 = vsubps_avx512vl(auVar34,auVar30);
              auVar35 = vsubps_avx512vl(auVar45,auVar25);
              auVar36 = vsubps_avx512vl(auVar29,auVar26);
              auVar37 = vsubps_avx512vl(auVar30,auVar31);
              auVar38 = vsubps_avx512vl(auVar25,auVar32);
              auVar39 = vsubps_avx512vl(auVar26,auVar33);
              auVar40 = vsubps_avx512vl(auVar31,auVar34);
              auVar24 = vaddps_avx512vl(auVar32,auVar45);
              auVar59._0_4_ = auVar33._0_4_ + auVar29._0_4_;
              auVar59._4_4_ = auVar33._4_4_ + auVar29._4_4_;
              auVar59._8_4_ = auVar33._8_4_ + auVar29._8_4_;
              auVar59._12_4_ = auVar33._12_4_ + auVar29._12_4_;
              auVar41 = vaddps_avx512vl(auVar34,auVar30);
              auVar42 = vmulps_avx512vl(auVar59,auVar28);
              auVar42 = vfmsub231ps_avx512vl(auVar42,auVar23,auVar41);
              auVar41 = vmulps_avx512vl(auVar41,auVar27);
              auVar41 = vfmsub231ps_avx512vl(auVar41,auVar28,auVar24);
              auVar43._0_4_ = auVar23._0_4_ * auVar24._0_4_;
              auVar43._4_4_ = auVar23._4_4_ * auVar24._4_4_;
              auVar43._8_4_ = auVar23._8_4_ * auVar24._8_4_;
              auVar43._12_4_ = auVar23._12_4_ * auVar24._12_4_;
              auVar24 = vfmsub231ps_fma(auVar43,auVar27,auVar59);
              auVar44._0_4_ = fVar5 * auVar24._0_4_;
              auVar44._4_4_ = fVar5 * auVar24._4_4_;
              auVar44._8_4_ = fVar5 * auVar24._8_4_;
              auVar44._12_4_ = fVar5 * auVar24._12_4_;
              auVar24 = vfmadd231ps_avx512vl(auVar44,auVar58,auVar41);
              auVar24 = vfmadd231ps_avx512vl(auVar24,auVar57,auVar42);
              auVar41 = vaddps_avx512vl(auVar45,auVar25);
              auVar42 = vaddps_avx512vl(auVar29,auVar26);
              auVar43 = vaddps_avx512vl(auVar30,auVar31);
              auVar44 = vmulps_avx512vl(auVar42,auVar37);
              auVar44 = vfmsub231ps_avx512vl(auVar44,auVar36,auVar43);
              auVar43 = vmulps_avx512vl(auVar43,auVar35);
              auVar43 = vfmsub231ps_avx512vl(auVar43,auVar37,auVar41);
              auVar41 = vmulps_avx512vl(auVar41,auVar36);
              auVar41 = vfmsub231ps_avx512vl(auVar41,auVar35,auVar42);
              auVar42._0_4_ = fVar5 * auVar41._0_4_;
              auVar42._4_4_ = fVar5 * auVar41._4_4_;
              auVar42._8_4_ = fVar5 * auVar41._8_4_;
              auVar42._12_4_ = fVar5 * auVar41._12_4_;
              auVar41 = vfmadd231ps_avx512vl(auVar42,auVar58,auVar43);
              auVar41 = vfmadd231ps_avx512vl(auVar41,auVar57,auVar44);
              auVar25 = vaddps_avx512vl(auVar25,auVar32);
              auVar26 = vaddps_avx512vl(auVar26,auVar33);
              auVar31 = vaddps_avx512vl(auVar31,auVar34);
              auVar32 = vmulps_avx512vl(auVar26,auVar40);
              auVar32 = vfmsub231ps_avx512vl(auVar32,auVar39,auVar31);
              auVar31 = vmulps_avx512vl(auVar31,auVar38);
              auVar31 = vfmsub231ps_avx512vl(auVar31,auVar40,auVar25);
              auVar25 = vmulps_avx512vl(auVar25,auVar39);
              auVar25 = vfmsub231ps_avx512vl(auVar25,auVar38,auVar26);
              auVar25 = vmulps_avx512vl(auVar60,auVar25);
              auVar25 = vfmadd231ps_avx512vl(auVar25,auVar58,auVar31);
              auVar25 = vfmadd231ps_avx512vl(auVar25,auVar57,auVar32);
              auVar61._0_4_ = auVar41._0_4_ + auVar24._0_4_;
              auVar61._4_4_ = auVar41._4_4_ + auVar24._4_4_;
              auVar61._8_4_ = auVar41._8_4_ + auVar24._8_4_;
              auVar61._12_4_ = auVar41._12_4_ + auVar24._12_4_;
              auVar26 = vaddps_avx512vl(auVar25,auVar61);
              auVar32._8_4_ = 0x7fffffff;
              auVar32._0_8_ = 0x7fffffff7fffffff;
              auVar32._12_4_ = 0x7fffffff;
              auVar31 = vandps_avx512vl(auVar26,auVar32);
              auVar33._8_4_ = 0x34000000;
              auVar33._0_8_ = 0x3400000034000000;
              auVar33._12_4_ = 0x34000000;
              auVar32 = vmulps_avx512vl(auVar31,auVar33);
              auVar33 = vminps_avx512vl(auVar24,auVar41);
              auVar33 = vminps_avx512vl(auVar33,auVar25);
              auVar34._8_4_ = 0x80000000;
              auVar34._0_8_ = 0x8000000080000000;
              auVar34._12_4_ = 0x80000000;
              auVar34 = vxorps_avx512vl(auVar32,auVar34);
              uVar12 = vcmpps_avx512vl(auVar33,auVar34,5);
              auVar33 = vmaxps_avx512vl(auVar24,auVar41);
              auVar25 = vmaxps_avx512vl(auVar33,auVar25);
              uVar10 = vcmpps_avx512vl(auVar25,auVar32,2);
              bVar22 = ((byte)uVar12 | (byte)uVar10) & 0xf;
              if (bVar22 != 0) {
                auVar25 = vmulps_avx512vl(auVar28,auVar36);
                auVar32 = vmulps_avx512vl(auVar27,auVar37);
                auVar33 = vmulps_avx512vl(auVar23,auVar35);
                auVar34 = vmulps_avx512vl(auVar37,auVar39);
                auVar42 = vmulps_avx512vl(auVar35,auVar40);
                auVar43 = vmulps_avx512vl(auVar36,auVar38);
                auVar23 = vfmsub213ps_avx512vl(auVar23,auVar37,auVar25);
                auVar28 = vfmsub213ps_avx512vl(auVar28,auVar35,auVar32);
                auVar27 = vfmsub213ps_avx512vl(auVar27,auVar36,auVar33);
                auVar36 = vfmsub213ps_avx512vl(auVar40,auVar36,auVar34);
                auVar37 = vfmsub213ps_avx512vl(auVar38,auVar37,auVar42);
                auVar35 = vfmsub213ps_avx512vl(auVar39,auVar35,auVar43);
                auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar25 = vandps_avx512vl(auVar25,auVar38);
                auVar34 = vandps_avx512vl(auVar34,auVar38);
                uVar19 = vcmpps_avx512vl(auVar25,auVar34,1);
                auVar25 = vandps_avx512vl(auVar32,auVar38);
                auVar32 = vandps_avx512vl(auVar42,auVar38);
                uVar20 = vcmpps_avx512vl(auVar25,auVar32,1);
                auVar25 = vandps_avx512vl(auVar33,auVar38);
                auVar32 = vandps_avx512vl(auVar43,auVar38);
                uVar13 = vcmpps_avx512vl(auVar25,auVar32,1);
                bVar9 = (bool)((byte)uVar19 & 1);
                local_12a8._0_4_ = (uint)bVar9 * auVar23._0_4_ | (uint)!bVar9 * auVar36._0_4_;
                bVar9 = (bool)((byte)(uVar19 >> 1) & 1);
                local_12a8._4_4_ = (uint)bVar9 * auVar23._4_4_ | (uint)!bVar9 * auVar36._4_4_;
                bVar9 = (bool)((byte)(uVar19 >> 2) & 1);
                local_12a8._8_4_ = (uint)bVar9 * auVar23._8_4_ | (uint)!bVar9 * auVar36._8_4_;
                bVar9 = (bool)((byte)(uVar19 >> 3) & 1);
                local_12a8._12_4_ = (uint)bVar9 * auVar23._12_4_ | (uint)!bVar9 * auVar36._12_4_;
                bVar9 = (bool)((byte)uVar20 & 1);
                local_1298._0_4_ = (uint)bVar9 * auVar28._0_4_ | (uint)!bVar9 * auVar37._0_4_;
                bVar9 = (bool)((byte)(uVar20 >> 1) & 1);
                local_1298._4_4_ = (uint)bVar9 * auVar28._4_4_ | (uint)!bVar9 * auVar37._4_4_;
                bVar9 = (bool)((byte)(uVar20 >> 2) & 1);
                local_1298._8_4_ = (uint)bVar9 * auVar28._8_4_ | (uint)!bVar9 * auVar37._8_4_;
                bVar9 = (bool)((byte)(uVar20 >> 3) & 1);
                local_1298._12_4_ = (uint)bVar9 * auVar28._12_4_ | (uint)!bVar9 * auVar37._12_4_;
                bVar9 = (bool)((byte)uVar13 & 1);
                local_1288._0_4_ =
                     (float)((uint)bVar9 * auVar27._0_4_ | (uint)!bVar9 * auVar35._0_4_);
                bVar9 = (bool)((byte)(uVar13 >> 1) & 1);
                local_1288._4_4_ =
                     (float)((uint)bVar9 * auVar27._4_4_ | (uint)!bVar9 * auVar35._4_4_);
                bVar9 = (bool)((byte)(uVar13 >> 2) & 1);
                local_1288._8_4_ =
                     (float)((uint)bVar9 * auVar27._8_4_ | (uint)!bVar9 * auVar35._8_4_);
                bVar9 = (bool)((byte)(uVar13 >> 3) & 1);
                local_1288._12_4_ =
                     (float)((uint)bVar9 * auVar27._12_4_ | (uint)!bVar9 * auVar35._12_4_);
                auVar38._0_4_ = fVar5 * local_1288._0_4_;
                auVar38._4_4_ = fVar5 * local_1288._4_4_;
                auVar38._8_4_ = fVar5 * local_1288._8_4_;
                auVar38._12_4_ = fVar5 * local_1288._12_4_;
                auVar23 = vfmadd213ps_fma(auVar58,local_1298,auVar38);
                auVar23 = vfmadd213ps_fma(auVar57,local_12a8,auVar23);
                auVar36._0_4_ = auVar23._0_4_ + auVar23._0_4_;
                auVar36._4_4_ = auVar23._4_4_ + auVar23._4_4_;
                auVar36._8_4_ = auVar23._8_4_ + auVar23._8_4_;
                auVar36._12_4_ = auVar23._12_4_ + auVar23._12_4_;
                auVar37._0_4_ = auVar30._0_4_ * local_1288._0_4_;
                auVar37._4_4_ = auVar30._4_4_ * local_1288._4_4_;
                auVar37._8_4_ = auVar30._8_4_ * local_1288._8_4_;
                auVar37._12_4_ = auVar30._12_4_ * local_1288._12_4_;
                auVar23 = vfmadd213ps_fma(auVar29,local_1298,auVar37);
                auVar23 = vfmadd213ps_fma(auVar45,local_12a8,auVar23);
                auVar45 = vrcp14ps_avx512vl(auVar36);
                auVar32 = auVar62._0_16_;
                auVar25 = vfnmadd213ps_avx512vl(auVar45,auVar36,auVar32);
                auVar45 = vfmadd132ps_fma(auVar25,auVar45,auVar45);
                local_12b8._0_4_ = (auVar23._0_4_ + auVar23._0_4_) * auVar45._0_4_;
                local_12b8._4_4_ = (auVar23._4_4_ + auVar23._4_4_) * auVar45._4_4_;
                local_12b8._8_4_ = (auVar23._8_4_ + auVar23._8_4_) * auVar45._8_4_;
                local_12b8._12_4_ = (auVar23._12_4_ + auVar23._12_4_) * auVar45._12_4_;
                uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar45._4_4_ = uVar4;
                auVar45._0_4_ = uVar4;
                auVar45._8_4_ = uVar4;
                auVar45._12_4_ = uVar4;
                uVar12 = vcmpps_avx512vl(local_12b8,auVar45,0xd);
                auVar28._8_4_ = 0x80000000;
                auVar28._0_8_ = 0x8000000080000000;
                auVar28._12_4_ = 0x80000000;
                auVar45 = vxorps_avx512vl(auVar36,auVar28);
                fVar5 = ray->tfar;
                auVar29._4_4_ = fVar5;
                auVar29._0_4_ = fVar5;
                auVar29._8_4_ = fVar5;
                auVar29._12_4_ = fVar5;
                uVar10 = vcmpps_avx512vl(local_12b8,auVar29,2);
                uVar11 = vcmpps_avx512vl(auVar36,auVar45,4);
                bVar22 = (byte)uVar12 & (byte)uVar10 & (byte)uVar11 & bVar22;
                if (bVar22 != 0) {
                  auVar30._8_4_ = 0x219392ef;
                  auVar30._0_8_ = 0x219392ef219392ef;
                  auVar30._12_4_ = 0x219392ef;
                  uVar19 = vcmpps_avx512vl(auVar31,auVar30,5);
                  auVar45 = vrcp14ps_avx512vl(auVar26);
                  auVar23 = vfnmadd213ps_avx512vl(auVar26,auVar45,auVar32);
                  auVar45 = vfmadd132ps_avx512vl(auVar23,auVar45,auVar45);
                  fVar5 = (float)((uint)((byte)uVar19 & 1) * auVar45._0_4_);
                  fVar1 = (float)((uint)((byte)(uVar19 >> 1) & 1) * auVar45._4_4_);
                  fVar2 = (float)((uint)((byte)(uVar19 >> 2) & 1) * auVar45._8_4_);
                  fVar3 = (float)((uint)((byte)(uVar19 >> 3) & 1) * auVar45._12_4_);
                  auVar39._0_4_ = fVar5 * auVar24._0_4_;
                  auVar39._4_4_ = fVar1 * auVar24._4_4_;
                  auVar39._8_4_ = fVar2 * auVar24._8_4_;
                  auVar39._12_4_ = fVar3 * auVar24._12_4_;
                  local_12d8 = vminps_avx512vl(auVar39,auVar32);
                  local_1440 = context->scene;
                  auVar40._0_4_ = fVar5 * auVar41._0_4_;
                  auVar40._4_4_ = fVar1 * auVar41._4_4_;
                  auVar40._8_4_ = fVar2 * auVar41._8_4_;
                  auVar40._12_4_ = fVar3 * auVar41._12_4_;
                  local_12c8 = vminps_avx512vl(auVar40,auVar32);
                  uVar19 = (ulong)bVar22;
                  local_1460 = uVar14;
                  do {
                    uVar20 = 0;
                    for (uVar13 = uVar19; (uVar13 & 1) == 0;
                        uVar13 = uVar13 >> 1 | 0x8000000000000000) {
                      uVar20 = uVar20 + 1;
                    }
                    h.geomID = *(uint *)(lVar15 + uVar17 + 0x120 + uVar20 * 4);
                    pGVar7 = (local_1440->geometries).items[h.geomID].ptr;
                    if ((pGVar7->mask & ray->mask) == 0) {
                      uVar19 = uVar19 ^ 1L << (uVar20 & 0x3f);
                      bVar9 = true;
                    }
                    else {
                      pRVar8 = context->args;
                      if ((pRVar8->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar9 = false;
                        uVar14 = local_1460;
                      }
                      else {
                        uVar14 = (ulong)(uint)((int)uVar20 * 4);
                        h.u = *(float *)(local_12d8 + uVar14);
                        h.v = *(float *)(local_12c8 + uVar14);
                        args.context = context->user;
                        h.primID = *(uint *)(lVar15 + uVar17 + 0x130 + uVar14);
                        h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_12a8 + uVar14);
                        h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_1298 + uVar14);
                        h.Ng.field_0.field_0.z = (float)*(undefined4 *)(local_1288 + uVar14);
                        h.instID[0] = (args.context)->instID[0];
                        h.instPrimID[0] = (args.context)->instPrimID[0];
                        fVar5 = ray->tfar;
                        ray->tfar = *(float *)(local_12b8 + uVar14);
                        local_149c = -1;
                        args.valid = &local_149c;
                        args.geometryUserPtr = pGVar7->userPtr;
                        args.hit = (RTCHitN *)&h;
                        args.N = 1;
                        local_11f8 = auVar63._0_32_;
                        local_1218 = auVar64._0_32_;
                        local_1238 = auVar65._0_32_;
                        local_1258 = auVar66._0_32_;
                        local_1278 = auVar67._0_32_;
                        args.ray = (RTCRayN *)ray;
                        if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00725e92:
                          if (pRVar8->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar8->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                              (*pRVar8->filter)(&args);
                              auVar67 = ZEXT3264(local_1278);
                              auVar66 = ZEXT3264(local_1258);
                              auVar65 = ZEXT3264(local_1238);
                              auVar64 = ZEXT3264(local_1218);
                              auVar63 = ZEXT3264(local_11f8);
                              auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar62 = ZEXT1664(auVar45);
                            }
                            if (*args.valid == 0) goto LAB_00725f4b;
                          }
                          bVar9 = false;
                          uVar14 = local_1460;
                        }
                        else {
                          local_1458 = ray;
                          local_1450 = context;
                          (*pGVar7->occlusionFilterN)(&args);
                          auVar67 = ZEXT3264(local_1278);
                          auVar66 = ZEXT3264(local_1258);
                          auVar65 = ZEXT3264(local_1238);
                          auVar64 = ZEXT3264(local_1218);
                          auVar63 = ZEXT3264(local_11f8);
                          auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar62 = ZEXT1664(auVar45);
                          context = local_1450;
                          ray = local_1458;
                          if (*args.valid != 0) goto LAB_00725e92;
LAB_00725f4b:
                          ray->tfar = fVar5;
                          uVar19 = uVar19 ^ 1L << (uVar20 & 0x3f);
                          bVar9 = true;
                          uVar14 = local_1460;
                        }
                      }
                    }
                    if (!bVar9) {
                      iVar16 = 0;
                      uVar19 = local_1468;
                      uVar20 = local_1470;
                      if (bVar21) {
                        ray->tfar = -INFINITY;
                        iVar16 = 3;
                      }
                      goto LAB_00725fc2;
                    }
                  } while (uVar19 != 0);
                }
              }
              uVar14 = uVar14 + 1;
              bVar21 = uVar14 < local_1448;
              iVar16 = 0;
              uVar19 = local_1468;
              uVar20 = local_1470;
            } while (uVar14 != local_1448);
          }
        }
LAB_00725fc2:
      } while (iVar16 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }